

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_explain.hpp
# Opt level: O1

void __thiscall duckdb::LogicalExplain::~LogicalExplain(LogicalExplain *this)

{
  pointer pcVar1;
  
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)&PTR__LogicalExplain_02488158;
  pcVar1 = (this->logical_plan_opt)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->logical_plan_opt).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->logical_plan_unopt)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->logical_plan_unopt).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->physical_plan)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->physical_plan).field_2) {
    operator_delete(pcVar1);
  }
  LogicalOperator::~LogicalOperator(&this->super_LogicalOperator);
  operator_delete(this);
  return;
}

Assistant:

explicit LogicalExplain(ExplainType explain_type)
	    : LogicalOperator(LogicalOperatorType::LOGICAL_EXPLAIN), explain_type(explain_type) {}